

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined4 in_register_0000003c;
  long *plVar5;
  _Alloc_hider _Var6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_class_1_0_00000001 hidden;
  anon_class_1_0_00000001 local_109;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar5 = (long *)CONCAT44(in_register_0000003c,__nfds);
  this = &local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar8 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar5,plVar5[1] + *plVar5);
    bVar1 = select::anon_class_1_0_00000001::operator()(&local_109,&local_68);
    uVar4 = (uint)CONCAT71(extraout_var,bVar1);
    _Var6._M_p = local_68._M_dataplus._M_p;
LAB_00112c29:
    uVar4 = uVar4 ^ 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar8) {
      operator_delete(_Var6._M_p);
    }
  }
  else if (__readfds->fds_bits[1] == __readfds->fds_bits[0]) {
LAB_00112c7d:
    uVar4 = 0;
  }
  else {
    plVar7 = (long *)(__readfds->fds_bits[1] + -0x20);
    iVar2 = std::__cxx11::string::compare((char *)plVar7);
    while (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)plVar7);
      if (iVar2 == 0) break;
      local_c8 = local_b8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,*plVar7,plVar7[1] + *plVar7);
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,*plVar5,plVar5[1] + *plVar5);
      _Var3 = std::
              __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                        (local_e8,local_e8 + local_e0,local_c8,local_c8 + local_c0);
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_e8 + local_e0);
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)_Var3._M_current != this) break;
      if (*(char *)*plVar7 == '!') {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)plVar7);
        local_108 = local_f8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_108,*plVar5,plVar5[1] + *plVar5);
        _Var3 = std::
                __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                          (local_108,local_108 + local_100,local_a8,local_a8 + local_a0);
        this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_108 + local_100);
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)_Var3._M_current != this) goto LAB_00112c7d;
        if (plVar7 == (long *)__readfds->fds_bits[0]) {
          paVar8 = &local_88.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar5,plVar5[1] + *plVar5)
          ;
          bVar1 = select::anon_class_1_0_00000001::operator()(&local_109,&local_88);
          uVar4 = (uint)CONCAT71(extraout_var_00,bVar1);
          _Var6._M_p = local_88._M_dataplus._M_p;
          goto LAB_00112c29;
        }
      }
      else if (plVar7 == (long *)__readfds->fds_bits[0]) goto LAB_00112c7d;
      plVar7 = plVar7 + -4;
      iVar2 = std::__cxx11::string::compare((char *)plVar7);
    }
    uVar4 = (uint)CONCAT71((int7)((ulong)this >> 8),1);
  }
  return uVar4;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}